

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseFormalNetsAreDriven(Abc_Ntk_t *pNtk,char *pNameFormal)

{
  int iVar1;
  void *pvVar2;
  Abc_Obj_t *pObj;
  int local_44;
  int local_40;
  int m;
  int j;
  int k;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pBox;
  Ver_Bundle_t *pBundle;
  char *pNameFormal_local;
  Abc_Ntk_t *pNtk_local;
  
  pBox = (Abc_Obj_t *)0x0;
  m = 0;
  do {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtk->pData);
    if (iVar1 <= m) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)pNtk->pData,m);
    local_40 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x40));
    do {
      local_40 = local_40 + -1;
      if (local_40 < 0) break;
      pBox = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x40),local_40);
    } while ((pBox == (Abc_Obj_t *)0x0) ||
            (iVar1 = strcmp((char *)pBox->pNtk,pNameFormal), iVar1 != 0));
    iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x40));
    if (local_40 != iVar1) {
      if (pBox == (Abc_Obj_t *)0x0) {
        __assert_fail("pBundle",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verCore.c"
                      ,0x9bc,"int Ver_ParseFormalNetsAreDriven(Abc_Ntk_t *, char *)");
      }
      for (local_44 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pBox->pNext), local_44 < iVar1;
          local_44 = local_44 + 1) {
        pObj = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pBox->pNext,local_44);
        iVar1 = Abc_ObjFaninNum(pObj);
        if (0 < iVar1) {
          return 1;
        }
      }
    }
    m = m + 1;
  } while( true );
}

Assistant:

int Ver_ParseFormalNetsAreDriven( Abc_Ntk_t * pNtk, char * pNameFormal )
{
    Ver_Bundle_t * pBundle = NULL;
    Abc_Obj_t * pBox, * pNet;
    int k, j, m;
    // go through instances of this type
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        // find a bundle with the given name in this instance
        Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
            if ( pBundle && !strcmp( pBundle->pNameFormal, pNameFormal ) )
                break;
        // skip non-driven bundles
        if ( j == Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // check if all nets are driven in this bundle
        assert(pBundle); // Verify that pBundle was assigned to.
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
            if ( Abc_ObjFaninNum(pNet) > 0 )
                return 1;
    }
    return 0;
}